

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O3

CollectorResult __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::emit
          (ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this,void *args)

{
  SignalLink *this_00;
  SignalLink *this_01;
  void *local_30;
  
  this_01 = this->callback_ring_;
  if (this_01 != (SignalLink *)0x0) {
    this_01->ref_count = this_01->ref_count + 1;
    do {
      if ((this_01->function).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_30 = args;
        (*(this_01->function)._M_invoker)((_Any_data *)&this_01->function,&local_30);
      }
      this_00 = this_01->next;
      this_00->ref_count = this_00->ref_count + 1;
      SignalLink::decref(this_01);
      this_01 = this_00;
    } while (this_00 != this->callback_ring_);
    SignalLink::decref(this_00);
  }
  return;
}

Assistant:

CollectorResult emit(Args... args) {
    Collector collector;
    if (!callback_ring_) return collector.result();
    SignalLink *link = callback_ring_;
    link->incref();
    do {
      if (link->function != 0) {
        const bool continue_emission =
            this->invoke(collector, link->function, args...);
        if (!continue_emission) break;
      }
      SignalLink *old = link;
      link = old->next;
      link->incref();
      old->decref();
    } while (link != callback_ring_);
    link->decref();
    return collector.result();
  }